

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

bool requiresMocing(string *text,string *macroName)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  RegularExpression qGadgetRegExp;
  RegularExpression qObjectRegExp;
  RegularExpression local_1c0;
  RegularExpression local_f0;
  
  pcVar3 = (text->_M_dataplus)._M_p;
  pcVar2 = strstr(pcVar3,"Q_OBJECT");
  if ((pcVar2 == (char *)0x0) && (pcVar3 = strstr(pcVar3,"Q_GADGET"), pcVar3 == (char *)0x0)) {
    return false;
  }
  local_f0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_f0,"[\n][ \t]*Q_OBJECT[^a-zA-Z0-9_]");
  bVar1 = cmsys::RegularExpression::find(&local_f0,(text->_M_dataplus)._M_p);
  if (bVar1) {
    bVar1 = true;
    std::__cxx11::string::_M_replace
              ((ulong)macroName,0,(char *)macroName->_M_string_length,0x4c7a8c);
  }
  else {
    local_1c0.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_1c0,"[\n][ \t]*Q_GADGET[^a-zA-Z0-9_]");
    bVar1 = cmsys::RegularExpression::find(&local_1c0,(text->_M_dataplus)._M_p);
    if (bVar1) {
      std::__cxx11::string::_M_replace
                ((ulong)macroName,0,(char *)macroName->_M_string_length,0x4c7a95);
    }
    if (local_1c0.program != (char *)0x0) {
      operator_delete__(local_1c0.program);
    }
  }
  if (local_f0.program != (char *)0x0) {
    operator_delete__(local_f0.program);
  }
  return bVar1;
}

Assistant:

static bool requiresMocing(const std::string& text, std::string &macroName)
{
  // this simple check is much much faster than the regexp
  if (strstr(text.c_str(), "Q_OBJECT") == NULL
      && strstr(text.c_str(), "Q_GADGET") == NULL)
    {
    return false;
    }

  cmsys::RegularExpression qObjectRegExp("[\n][ \t]*Q_OBJECT[^a-zA-Z0-9_]");
  if (qObjectRegExp.find(text))
    {
    macroName = "Q_OBJECT";
    return true;
    }
  cmsys::RegularExpression qGadgetRegExp("[\n][ \t]*Q_GADGET[^a-zA-Z0-9_]");
  if (qGadgetRegExp.find(text))
    {
    macroName = "Q_GADGET";
    return true;
    }
  return false;
}